

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O1

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  iVar5 = (int)first;
  if (iVar5 < (int)(uint)(ushort)c->width) {
    __assert_fail("first->x <= x0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                  ,0x125,
                  "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
  }
  if (iVar5 < (int)(uint)**(ushort **)&c->align) {
    uVar1 = (ushort)c->width;
    uVar2 = 0;
    iVar6 = 0;
    if ((int)(uint)uVar1 < x0 + iVar5) {
      iVar6 = 0;
      iVar7 = 0;
      uVar2 = 0;
      do {
        uVar8 = (uint)uVar1;
        uVar3 = (uint)*(ushort *)((long)&c->width + 2);
        if (uVar2 < uVar3) {
          iVar4 = (uVar3 - uVar2) * iVar7;
          uVar2 = uVar3;
          if ((int)uVar8 < iVar5) {
            iVar9 = (uint)**(ushort **)&c->align - iVar5;
          }
          else {
            iVar9 = **(ushort **)&c->align - uVar8;
          }
        }
        else {
          iVar4 = **(ushort **)&c->align - uVar8;
          iVar9 = x0 - iVar7;
          if (iVar4 + iVar7 <= x0) {
            iVar9 = iVar4;
          }
          iVar4 = (uVar2 - uVar3) * iVar9;
        }
        iVar6 = iVar6 + iVar4;
        iVar7 = iVar7 + iVar9;
        c = *(stbrp_context **)&c->align;
        uVar1 = (ushort)c->width;
      } while ((int)(uint)uVar1 < x0 + iVar5);
    }
    *(int *)CONCAT44(in_register_0000000c,width) = iVar6;
    return uVar2;
  }
  __assert_fail("node->next->x > x0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                ,300,"int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)"
               );
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}